

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx512::
     BVHNIntersector1<8,_1,_true,_embree::avx512::ArrayIntersector1<embree::avx512::QuadMiIntersector1Pluecker<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float fVar1;
  float fVar7;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar8;
  Scene *pSVar9;
  float **ppfVar10;
  float *pfVar11;
  float *pfVar12;
  float *pfVar13;
  float *pfVar14;
  Geometry *pGVar15;
  RTCIntersectArguments *pRVar16;
  bool bVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined8 uVar20;
  undefined8 uVar21;
  ulong uVar22;
  undefined8 uVar23;
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  ulong uVar29;
  long lVar30;
  long lVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  ulong uVar36;
  ulong unaff_R12;
  size_t mask;
  int iVar37;
  ulong uVar38;
  ulong uVar39;
  bool bVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  float fVar68;
  undefined4 uVar69;
  undefined1 auVar70 [32];
  undefined1 auVar71 [16];
  undefined1 auVar72 [32];
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [64];
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  undefined1 auVar84 [32];
  undefined1 auVar85 [64];
  undefined1 auVar86 [32];
  undefined1 auVar87 [64];
  undefined1 auVar88 [64];
  undefined1 auVar89 [64];
  undefined1 auVar90 [64];
  undefined1 auVar91 [64];
  undefined1 auVar92 [64];
  Scene *scene;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  NodeRef stack [564];
  ulong *local_1650;
  int local_1624;
  ulong local_1620;
  RayQueryContext *local_1618;
  ulong local_1610;
  ulong local_1608;
  ulong local_1600;
  Ray *local_15f8;
  ulong local_15f0;
  ulong local_15e8;
  undefined4 local_15e0;
  undefined4 local_15dc;
  undefined4 local_15d8;
  undefined4 local_15d4;
  undefined4 local_15d0;
  undefined4 local_15cc;
  uint local_15c8;
  uint local_15c4;
  uint local_15c0;
  RTCFilterFunctionNArguments local_15b0;
  undefined1 local_1580 [32];
  undefined1 local_1560 [32];
  undefined1 local_1540 [32];
  undefined1 local_1520 [32];
  float local_1500;
  float fStack_14fc;
  float fStack_14f8;
  float fStack_14f4;
  float fStack_14f0;
  float fStack_14ec;
  float fStack_14e8;
  float fStack_14e4;
  undefined1 local_14e0 [32];
  undefined1 local_14c0 [32];
  undefined1 local_14a0 [32];
  undefined1 local_1480 [32];
  undefined1 local_1460 [32];
  undefined1 local_1440 [32];
  undefined1 local_1420 [32];
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined8 uStack_13f0;
  undefined8 uStack_13e8;
  undefined8 local_13e0;
  undefined8 uStack_13d8;
  undefined8 uStack_13d0;
  undefined8 uStack_13c8;
  undefined1 local_13c0 [32];
  undefined1 local_13a0 [32];
  undefined1 local_1380 [32];
  undefined1 local_1360 [32];
  undefined1 local_1340 [32];
  undefined1 local_1320 [32];
  byte local_1300;
  undefined1 local_12e0 [32];
  undefined1 local_12c0 [32];
  undefined1 local_12a0 [32];
  undefined1 local_1280 [32];
  undefined1 local_1260 [32];
  undefined1 local_1240 [32];
  undefined1 local_1220;
  ulong local_1200 [570];
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined1 auVar43 [16];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    fVar78 = ray->tfar;
    if (0.0 <= fVar78) {
      local_1650 = local_1200 + 1;
      aVar8 = (ray->dir).field_0;
      auVar18 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar41._8_4_ = 0x7fffffff;
      auVar41._0_8_ = 0x7fffffff7fffffff;
      auVar41._12_4_ = 0x7fffffff;
      auVar41 = vandps_avx512vl((undefined1  [16])aVar8,auVar41);
      auVar42._8_4_ = 0x219392ef;
      auVar42._0_8_ = 0x219392ef219392ef;
      auVar42._12_4_ = 0x219392ef;
      uVar36 = vcmpps_avx512vl(auVar41,auVar42,1);
      local_1200[0] = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
      auVar71._8_4_ = 0x3f800000;
      auVar71._0_8_ = &DAT_3f8000003f800000;
      auVar71._12_4_ = 0x3f800000;
      auVar41 = vdivps_avx(auVar71,(undefined1  [16])aVar8);
      auVar42 = vbroadcastss_avx512vl(ZEXT416(0x5d5e0b6b));
      bVar40 = (bool)((byte)uVar36 & 1);
      auVar43._0_4_ = (uint)bVar40 * auVar42._0_4_ | (uint)!bVar40 * auVar41._0_4_;
      bVar40 = (bool)((byte)(uVar36 >> 1) & 1);
      auVar43._4_4_ = (uint)bVar40 * auVar42._4_4_ | (uint)!bVar40 * auVar41._4_4_;
      bVar40 = (bool)((byte)(uVar36 >> 2) & 1);
      auVar43._8_4_ = (uint)bVar40 * auVar42._8_4_ | (uint)!bVar40 * auVar41._8_4_;
      bVar40 = (bool)((byte)(uVar36 >> 3) & 1);
      auVar43._12_4_ = (uint)bVar40 * auVar42._12_4_ | (uint)!bVar40 * auVar41._12_4_;
      auVar44._8_4_ = 0x3f7ffffa;
      auVar44._0_8_ = 0x3f7ffffa3f7ffffa;
      auVar44._12_4_ = 0x3f7ffffa;
      auVar44 = vmulps_avx512vl(auVar43,auVar44);
      auVar45._8_4_ = 0x3f800003;
      auVar45._0_8_ = 0x3f8000033f800003;
      auVar45._12_4_ = 0x3f800003;
      auVar45 = vmulps_avx512vl(auVar43,auVar45);
      auVar46 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->org).field_0.m128[0]));
      auVar87 = ZEXT3264(auVar46);
      auVar46 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->org).field_0.m128[1]));
      auVar88 = ZEXT3264(auVar46);
      auVar46 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->org).field_0.m128[2]));
      auVar89 = ZEXT3264(auVar46);
      auVar46 = vbroadcastss_avx512vl(auVar44);
      auVar90 = ZEXT3264(auVar46);
      auVar41 = vmovshdup_avx(auVar44);
      auVar46 = vbroadcastsd_avx512vl(auVar41);
      auVar91 = ZEXT3264(auVar46);
      auVar47._8_4_ = 2;
      auVar47._0_8_ = 0x200000002;
      auVar47._12_4_ = 2;
      auVar47._16_4_ = 2;
      auVar47._20_4_ = 2;
      auVar47._24_4_ = 2;
      auVar47._28_4_ = 2;
      auVar42 = vshufpd_avx(auVar44,auVar44,1);
      auVar46 = vpermps_avx512vl(auVar47,ZEXT1632(auVar44));
      auVar92 = ZEXT3264(auVar46);
      fVar68 = auVar45._0_4_;
      auVar46._8_4_ = 1;
      auVar46._0_8_ = 0x100000001;
      auVar46._12_4_ = 1;
      auVar46._16_4_ = 1;
      auVar46._20_4_ = 1;
      auVar46._24_4_ = 1;
      auVar46._28_4_ = 1;
      local_1520 = vpermps_avx2(auVar46,ZEXT1632(auVar45));
      auVar85 = ZEXT3264(local_1520);
      local_1540 = vpermps_avx2(auVar47,ZEXT1632(auVar45));
      auVar74 = ZEXT3264(local_1540);
      uVar36 = (ulong)(auVar44._0_4_ < 0.0) << 5;
      local_1620 = (ulong)(auVar41._0_4_ < 0.0) << 5 | 0x40;
      uVar38 = (ulong)(auVar42._0_4_ < 0.0) << 5 | 0x80;
      uVar39 = uVar36 ^ 0x20;
      uVar32 = local_1620 ^ 0x20;
      uVar35 = uVar38 ^ 0x20;
      uVar69 = auVar18._0_4_;
      local_1560._4_4_ = uVar69;
      local_1560._0_4_ = uVar69;
      local_1560._8_4_ = uVar69;
      local_1560._12_4_ = uVar69;
      local_1560._16_4_ = uVar69;
      local_1560._20_4_ = uVar69;
      local_1560._24_4_ = uVar69;
      local_1560._28_4_ = uVar69;
      auVar73 = ZEXT3264(local_1560);
      local_1580._4_4_ = fVar78;
      local_1580._0_4_ = fVar78;
      local_1580._8_4_ = fVar78;
      local_1580._12_4_ = fVar78;
      local_1580._16_4_ = fVar78;
      local_1580._20_4_ = fVar78;
      local_1580._24_4_ = fVar78;
      local_1580._28_4_ = fVar78;
      auVar77 = ZEXT3264(local_1580);
      local_1500 = fVar68;
      fStack_14fc = fVar68;
      fStack_14f8 = fVar68;
      fStack_14f4 = fVar68;
      fStack_14f0 = fVar68;
      fStack_14ec = fVar68;
      fStack_14e8 = fVar68;
      fStack_14e4 = fVar68;
      local_1608 = uVar38;
      local_1610 = uVar39;
      local_1618 = context;
      fVar78 = fVar68;
      fVar79 = fVar68;
      fVar80 = fVar68;
      fVar81 = fVar68;
      fVar82 = fVar68;
      fVar83 = fVar68;
      do {
        if (local_1650 == local_1200) {
          return;
        }
        uVar34 = local_1650[-1];
        local_1650 = local_1650 + -1;
        do {
          if ((uVar34 & 8) == 0) {
            auVar46 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar34 + 0x40 + uVar36),auVar87._0_32_)
            ;
            auVar46 = vmulps_avx512vl(auVar90._0_32_,auVar46);
            auVar47 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar34 + 0x40 + local_1620),
                                      auVar88._0_32_);
            auVar47 = vmulps_avx512vl(auVar91._0_32_,auVar47);
            auVar46 = vmaxps_avx(auVar46,auVar47);
            auVar47 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar34 + 0x40 + uVar38),auVar89._0_32_)
            ;
            auVar47 = vmulps_avx512vl(auVar92._0_32_,auVar47);
            auVar47 = vmaxps_avx(auVar47,auVar73._0_32_);
            auVar46 = vmaxps_avx(auVar46,auVar47);
            auVar47 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar34 + 0x40 + uVar39),auVar87._0_32_)
            ;
            auVar48._4_4_ = fVar78 * auVar47._4_4_;
            auVar48._0_4_ = fVar68 * auVar47._0_4_;
            auVar48._8_4_ = fVar79 * auVar47._8_4_;
            auVar48._12_4_ = fVar80 * auVar47._12_4_;
            auVar48._16_4_ = fVar81 * auVar47._16_4_;
            auVar48._20_4_ = fVar82 * auVar47._20_4_;
            auVar48._24_4_ = fVar83 * auVar47._24_4_;
            auVar48._28_4_ = auVar47._28_4_;
            auVar47 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar34 + 0x40 + uVar32),auVar88._0_32_)
            ;
            auVar51._4_4_ = auVar85._4_4_ * auVar47._4_4_;
            auVar51._0_4_ = auVar85._0_4_ * auVar47._0_4_;
            auVar51._8_4_ = auVar85._8_4_ * auVar47._8_4_;
            auVar51._12_4_ = auVar85._12_4_ * auVar47._12_4_;
            auVar51._16_4_ = auVar85._16_4_ * auVar47._16_4_;
            auVar51._20_4_ = auVar85._20_4_ * auVar47._20_4_;
            auVar51._24_4_ = auVar85._24_4_ * auVar47._24_4_;
            auVar51._28_4_ = auVar47._28_4_;
            auVar47 = vminps_avx(auVar48,auVar51);
            auVar48 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar34 + 0x40 + uVar35),auVar89._0_32_)
            ;
            auVar49._4_4_ = auVar74._4_4_ * auVar48._4_4_;
            auVar49._0_4_ = auVar74._0_4_ * auVar48._0_4_;
            auVar49._8_4_ = auVar74._8_4_ * auVar48._8_4_;
            auVar49._12_4_ = auVar74._12_4_ * auVar48._12_4_;
            auVar49._16_4_ = auVar74._16_4_ * auVar48._16_4_;
            auVar49._20_4_ = auVar74._20_4_ * auVar48._20_4_;
            auVar49._24_4_ = auVar74._24_4_ * auVar48._24_4_;
            auVar49._28_4_ = auVar48._28_4_;
            auVar48 = vminps_avx(auVar49,auVar77._0_32_);
            auVar47 = vminps_avx(auVar47,auVar48);
            uVar20 = vcmpps_avx512vl(auVar46,auVar47,2);
            unaff_R12 = CONCAT44((int)(unaff_R12 >> 0x20),(uint)(byte)uVar20);
          }
          if ((uVar34 & 8) == 0) {
            if (unaff_R12 == 0) {
              iVar37 = 4;
            }
            else {
              uVar33 = uVar34 & 0xfffffffffffffff0;
              lVar31 = 0;
              for (uVar34 = unaff_R12; (uVar34 & 1) == 0; uVar34 = uVar34 >> 1 | 0x8000000000000000)
              {
                lVar31 = lVar31 + 1;
              }
              iVar37 = 0;
              for (uVar29 = unaff_R12 - 1 & unaff_R12; uVar34 = *(ulong *)(uVar33 + lVar31 * 8),
                  uVar29 != 0; uVar29 = uVar29 - 1 & uVar29) {
                *local_1650 = uVar34;
                local_1650 = local_1650 + 1;
                lVar31 = 0;
                for (uVar34 = uVar29; (uVar34 & 1) == 0; uVar34 = uVar34 >> 1 | 0x8000000000000000)
                {
                  lVar31 = lVar31 + 1;
                }
              }
            }
          }
          else {
            iVar37 = 6;
          }
        } while (iVar37 == 0);
        if (iVar37 == 6) {
          iVar37 = 0;
          local_15f0 = (ulong)((uint)uVar34 & 0xf) - 8;
          bVar40 = local_15f0 != 0;
          if (bVar40) {
            uVar34 = uVar34 & 0xfffffffffffffff0;
            pSVar9 = local_1618->scene;
            local_15e8 = 0;
            do {
              lVar30 = local_15e8 * 0x60;
              ppfVar10 = (pSVar9->vertices).items;
              pfVar11 = ppfVar10[*(uint *)(uVar34 + 0x48 + lVar30)];
              auVar53._16_16_ = *(undefined1 (*) [16])(pfVar11 + *(uint *)(uVar34 + 0x28 + lVar30));
              auVar53._0_16_ = *(undefined1 (*) [16])(pfVar11 + *(uint *)(uVar34 + 8 + lVar30));
              pfVar12 = ppfVar10[*(uint *)(uVar34 + 0x40 + lVar30)];
              auVar55._16_16_ = *(undefined1 (*) [16])(pfVar12 + *(uint *)(uVar34 + 0x20 + lVar30));
              auVar55._0_16_ = *(undefined1 (*) [16])(pfVar12 + *(uint *)(uVar34 + lVar30));
              pfVar13 = ppfVar10[*(uint *)(uVar34 + 0x4c + lVar30)];
              auVar58._16_16_ = *(undefined1 (*) [16])(pfVar13 + *(uint *)(uVar34 + 0x2c + lVar30));
              auVar58._0_16_ = *(undefined1 (*) [16])(pfVar13 + *(uint *)(uVar34 + 0xc + lVar30));
              pfVar14 = ppfVar10[*(uint *)(uVar34 + 0x44 + lVar30)];
              auVar59._16_16_ = *(undefined1 (*) [16])(pfVar14 + *(uint *)(uVar34 + 0x24 + lVar30));
              auVar59._0_16_ = *(undefined1 (*) [16])(pfVar14 + *(uint *)(uVar34 + 4 + lVar30));
              lVar31 = uVar34 + 0x40 + lVar30;
              local_13e0 = *(undefined8 *)(lVar31 + 0x10);
              uStack_13d8 = *(undefined8 *)(lVar31 + 0x18);
              uStack_13d0 = local_13e0;
              uStack_13c8 = uStack_13d8;
              lVar31 = uVar34 + 0x50 + lVar30;
              local_1400 = *(undefined8 *)(lVar31 + 0x10);
              uStack_13f8 = *(undefined8 *)(lVar31 + 0x18);
              auVar42 = vunpcklps_avx(*(undefined1 (*) [16])
                                       (pfVar12 + *(uint *)(uVar34 + 0x10 + lVar30)),
                                      *(undefined1 (*) [16])
                                       (pfVar11 + *(uint *)(uVar34 + 0x18 + lVar30)));
              auVar41 = vunpckhps_avx(*(undefined1 (*) [16])
                                       (pfVar12 + *(uint *)(uVar34 + 0x10 + lVar30)),
                                      *(undefined1 (*) [16])
                                       (pfVar11 + *(uint *)(uVar34 + 0x18 + lVar30)));
              auVar44 = vunpcklps_avx(*(undefined1 (*) [16])
                                       (pfVar14 + *(uint *)(uVar34 + 0x14 + lVar30)),
                                      *(undefined1 (*) [16])
                                       (pfVar13 + *(uint *)(uVar34 + 0x1c + lVar30)));
              auVar18 = vunpckhps_avx(*(undefined1 (*) [16])
                                       (pfVar14 + *(uint *)(uVar34 + 0x14 + lVar30)),
                                      *(undefined1 (*) [16])
                                       (pfVar13 + *(uint *)(uVar34 + 0x1c + lVar30)));
              auVar45 = vunpcklps_avx(auVar41,auVar18);
              auVar43 = vunpcklps_avx(auVar42,auVar44);
              auVar41 = vunpckhps_avx(auVar42,auVar44);
              auVar44 = vunpcklps_avx(*(undefined1 (*) [16])
                                       (pfVar12 + *(uint *)(uVar34 + 0x30 + lVar30)),
                                      *(undefined1 (*) [16])
                                       (pfVar11 + *(uint *)(uVar34 + 0x38 + lVar30)));
              auVar18 = vunpckhps_avx(*(undefined1 (*) [16])
                                       (pfVar12 + *(uint *)(uVar34 + 0x30 + lVar30)),
                                      *(undefined1 (*) [16])
                                       (pfVar11 + *(uint *)(uVar34 + 0x38 + lVar30)));
              auVar71 = vunpcklps_avx(*(undefined1 (*) [16])
                                       (pfVar14 + *(uint *)(uVar34 + 0x34 + lVar30)),
                                      *(undefined1 (*) [16])
                                       (pfVar13 + *(uint *)(uVar34 + 0x3c + lVar30)));
              auVar42 = vunpckhps_avx(*(undefined1 (*) [16])
                                       (pfVar14 + *(uint *)(uVar34 + 0x34 + lVar30)),
                                      *(undefined1 (*) [16])
                                       (pfVar13 + *(uint *)(uVar34 + 0x3c + lVar30)));
              auVar42 = vunpcklps_avx(auVar18,auVar42);
              auVar19 = vunpcklps_avx(auVar44,auVar71);
              auVar18 = vunpckhps_avx(auVar44,auVar71);
              uStack_13f0 = local_1400;
              uStack_13e8 = uStack_13f8;
              auVar46 = vunpcklps_avx(auVar59,auVar58);
              auVar47 = vunpcklps_avx(auVar55,auVar53);
              auVar51 = vunpcklps_avx(auVar47,auVar46);
              auVar47 = vunpckhps_avx(auVar47,auVar46);
              auVar46 = vunpckhps_avx(auVar59,auVar58);
              auVar48 = vunpckhps_avx(auVar55,auVar53);
              auVar48 = vunpcklps_avx(auVar48,auVar46);
              auVar57._16_16_ = auVar43;
              auVar57._0_16_ = auVar43;
              auVar60._16_16_ = auVar41;
              auVar60._0_16_ = auVar41;
              auVar54._16_16_ = auVar45;
              auVar54._0_16_ = auVar45;
              auVar61._16_16_ = auVar19;
              auVar61._0_16_ = auVar19;
              auVar62._16_16_ = auVar18;
              auVar62._0_16_ = auVar18;
              uVar69 = *(undefined4 *)&(ray->org).field_0;
              auVar63._4_4_ = uVar69;
              auVar63._0_4_ = uVar69;
              auVar63._8_4_ = uVar69;
              auVar63._12_4_ = uVar69;
              auVar63._16_4_ = uVar69;
              auVar63._20_4_ = uVar69;
              auVar63._24_4_ = uVar69;
              auVar63._28_4_ = uVar69;
              auVar49 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->org).field_0.m128[1]));
              auVar50 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->org).field_0.m128[2]));
              uVar69 = *(undefined4 *)&(ray->dir).field_0;
              auVar72._4_4_ = uVar69;
              auVar72._0_4_ = uVar69;
              auVar72._8_4_ = uVar69;
              auVar72._12_4_ = uVar69;
              auVar72._16_4_ = uVar69;
              auVar72._20_4_ = uVar69;
              auVar72._24_4_ = uVar69;
              auVar72._28_4_ = uVar69;
              auVar56._16_16_ = auVar42;
              auVar56._0_16_ = auVar42;
              uVar69 = *(undefined4 *)((long)&(ray->dir).field_0 + 4);
              auVar75._4_4_ = uVar69;
              auVar75._0_4_ = uVar69;
              auVar75._8_4_ = uVar69;
              auVar75._12_4_ = uVar69;
              auVar75._16_4_ = uVar69;
              auVar75._20_4_ = uVar69;
              auVar75._24_4_ = uVar69;
              auVar75._28_4_ = uVar69;
              fVar7 = (ray->dir).field_0.m128[2];
              auVar84._4_4_ = fVar7;
              auVar84._0_4_ = fVar7;
              auVar84._8_4_ = fVar7;
              auVar84._12_4_ = fVar7;
              auVar84._16_4_ = fVar7;
              auVar84._20_4_ = fVar7;
              auVar84._24_4_ = fVar7;
              auVar84._28_4_ = fVar7;
              auVar46 = vsubps_avx(auVar51,auVar63);
              auVar51 = vsubps_avx512vl(auVar47,auVar49);
              auVar48 = vsubps_avx512vl(auVar48,auVar50);
              auVar52 = vsubps_avx512vl(auVar57,auVar63);
              auVar53 = vsubps_avx512vl(auVar60,auVar49);
              auVar54 = vsubps_avx512vl(auVar54,auVar50);
              auVar55 = vsubps_avx512vl(auVar61,auVar63);
              auVar49 = vsubps_avx512vl(auVar62,auVar49);
              auVar50 = vsubps_avx512vl(auVar56,auVar50);
              auVar56 = vsubps_avx512vl(auVar55,auVar46);
              auVar47 = vsubps_avx(auVar49,auVar51);
              auVar57 = vsubps_avx512vl(auVar50,auVar48);
              auVar58 = vsubps_avx512vl(auVar46,auVar52);
              auVar59 = vsubps_avx512vl(auVar51,auVar53);
              auVar60 = vsubps_avx512vl(auVar48,auVar54);
              auVar61 = vsubps_avx512vl(auVar52,auVar55);
              auVar62 = vsubps_avx512vl(auVar53,auVar49);
              auVar63 = vsubps_avx512vl(auVar54,auVar50);
              auVar64 = vaddps_avx512vl(auVar55,auVar46);
              auVar86._0_4_ = auVar49._0_4_ + auVar51._0_4_;
              auVar86._4_4_ = auVar49._4_4_ + auVar51._4_4_;
              auVar86._8_4_ = auVar49._8_4_ + auVar51._8_4_;
              auVar86._12_4_ = auVar49._12_4_ + auVar51._12_4_;
              auVar86._16_4_ = auVar49._16_4_ + auVar51._16_4_;
              auVar86._20_4_ = auVar49._20_4_ + auVar51._20_4_;
              auVar86._24_4_ = auVar49._24_4_ + auVar51._24_4_;
              auVar86._28_4_ = auVar49._28_4_ + auVar51._28_4_;
              auVar65 = vaddps_avx512vl(auVar50,auVar48);
              auVar66 = vmulps_avx512vl(auVar86,auVar57);
              auVar66 = vfmsub231ps_avx512vl(auVar66,auVar47,auVar65);
              auVar65 = vmulps_avx512vl(auVar65,auVar56);
              auVar67 = vfmsub231ps_avx512vl(auVar65,auVar57,auVar64);
              auVar65._4_4_ = auVar47._4_4_ * auVar64._4_4_;
              auVar65._0_4_ = auVar47._0_4_ * auVar64._0_4_;
              auVar65._8_4_ = auVar47._8_4_ * auVar64._8_4_;
              auVar65._12_4_ = auVar47._12_4_ * auVar64._12_4_;
              auVar65._16_4_ = auVar47._16_4_ * auVar64._16_4_;
              auVar65._20_4_ = auVar47._20_4_ * auVar64._20_4_;
              auVar65._24_4_ = auVar47._24_4_ * auVar64._24_4_;
              auVar65._28_4_ = auVar64._28_4_;
              auVar41 = vfmsub231ps_fma(auVar65,auVar56,auVar86);
              auVar70._0_4_ = fVar7 * auVar41._0_4_;
              auVar70._4_4_ = fVar7 * auVar41._4_4_;
              auVar70._8_4_ = fVar7 * auVar41._8_4_;
              auVar70._12_4_ = fVar7 * auVar41._12_4_;
              auVar70._16_4_ = fVar7 * 0.0;
              auVar70._20_4_ = fVar7 * 0.0;
              auVar70._24_4_ = fVar7 * 0.0;
              auVar70._28_4_ = 0;
              auVar65 = vfmadd231ps_avx512vl(auVar70,auVar75,auVar67);
              local_13c0 = vfmadd231ps_avx512vl(auVar65,auVar72,auVar66);
              auVar65 = vaddps_avx512vl(auVar46,auVar52);
              auVar64 = vaddps_avx512vl(auVar51,auVar53);
              auVar66 = vaddps_avx512vl(auVar48,auVar54);
              auVar67 = vmulps_avx512vl(auVar64,auVar60);
              auVar67 = vfmsub231ps_avx512vl(auVar67,auVar59,auVar66);
              auVar66 = vmulps_avx512vl(auVar66,auVar58);
              auVar66 = vfmsub231ps_avx512vl(auVar66,auVar60,auVar65);
              auVar65 = vmulps_avx512vl(auVar65,auVar59);
              auVar65 = vfmsub231ps_avx512vl(auVar65,auVar58,auVar64);
              auVar64._4_4_ = fVar7 * auVar65._4_4_;
              auVar64._0_4_ = fVar7 * auVar65._0_4_;
              auVar64._8_4_ = fVar7 * auVar65._8_4_;
              auVar64._12_4_ = fVar7 * auVar65._12_4_;
              auVar64._16_4_ = fVar7 * auVar65._16_4_;
              auVar64._20_4_ = fVar7 * auVar65._20_4_;
              auVar64._24_4_ = fVar7 * auVar65._24_4_;
              auVar64._28_4_ = auVar65._28_4_;
              auVar65 = vfmadd231ps_avx512vl(auVar64,auVar75,auVar66);
              local_13a0 = vfmadd231ps_avx512vl(auVar65,auVar72,auVar67);
              auVar52 = vaddps_avx512vl(auVar52,auVar55);
              auVar49 = vaddps_avx512vl(auVar53,auVar49);
              auVar50 = vaddps_avx512vl(auVar54,auVar50);
              auVar65 = vmulps_avx512vl(auVar49,auVar63);
              auVar65 = vfmsub231ps_avx512vl(auVar65,auVar62,auVar50);
              auVar50 = vmulps_avx512vl(auVar50,auVar61);
              auVar50 = vfmsub231ps_avx512vl(auVar50,auVar63,auVar52);
              auVar52 = vmulps_avx512vl(auVar52,auVar62);
              auVar49 = vfmsub231ps_avx512vl(auVar52,auVar61,auVar49);
              auVar49 = vmulps_avx512vl(auVar84,auVar49);
              auVar49 = vfmadd231ps_avx512vl(auVar49,auVar75,auVar50);
              auVar49 = vfmadd231ps_avx512vl(auVar49,auVar72,auVar65);
              auVar66._0_4_ = local_13a0._0_4_ + local_13c0._0_4_;
              auVar66._4_4_ = local_13a0._4_4_ + local_13c0._4_4_;
              auVar66._8_4_ = local_13a0._8_4_ + local_13c0._8_4_;
              auVar66._12_4_ = local_13a0._12_4_ + local_13c0._12_4_;
              auVar66._16_4_ = local_13a0._16_4_ + local_13c0._16_4_;
              auVar66._20_4_ = local_13a0._20_4_ + local_13c0._20_4_;
              auVar66._24_4_ = local_13a0._24_4_ + local_13c0._24_4_;
              auVar66._28_4_ = local_13a0._28_4_ + local_13c0._28_4_;
              local_1380 = vaddps_avx512vl(auVar49,auVar66);
              local_14e0 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
              vandps_avx512vl(local_1380,local_14e0);
              auVar50._8_4_ = 0x34000000;
              auVar50._0_8_ = 0x3400000034000000;
              auVar50._12_4_ = 0x34000000;
              auVar50._16_4_ = 0x34000000;
              auVar50._20_4_ = 0x34000000;
              auVar50._24_4_ = 0x34000000;
              auVar50._28_4_ = 0x34000000;
              auVar50 = vmulps_avx512vl(local_14e0,auVar50);
              auVar52 = vminps_avx512vl(local_13c0,local_13a0);
              auVar65 = vminps_avx512vl(auVar52,auVar49);
              auVar52._8_4_ = 0x80000000;
              auVar52._0_8_ = 0x8000000080000000;
              auVar52._12_4_ = 0x80000000;
              auVar52._16_4_ = 0x80000000;
              auVar52._20_4_ = 0x80000000;
              auVar52._24_4_ = 0x80000000;
              auVar52._28_4_ = 0x80000000;
              auVar52 = vxorps_avx512vl(auVar50,auVar52);
              uVar20 = vcmpps_avx512vl(auVar65,auVar52,5);
              auVar52 = vmaxps_avx512vl(local_13c0,local_13a0);
              auVar49 = vmaxps_avx512vl(auVar52,auVar49);
              uVar21 = vcmpps_avx512vl(auVar49,auVar50,2);
              local_1300 = (byte)uVar20 | (byte)uVar21;
              auVar49 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
              fVar78 = fStack_14fc;
              fVar79 = fStack_14f8;
              fVar80 = fStack_14f4;
              fVar81 = fStack_14f0;
              fVar82 = fStack_14ec;
              fVar83 = fStack_14e8;
              fVar68 = local_1500;
              if (local_1300 == 0) {
LAB_00729618:
                auVar85 = ZEXT3264(local_1520);
                auVar74 = ZEXT3264(local_1540);
                auVar73 = ZEXT3264(local_1560);
                auVar77 = ZEXT3264(local_1580);
              }
              else {
                auVar50 = vmulps_avx512vl(auVar57,auVar59);
                auVar52 = vmulps_avx512vl(auVar56,auVar60);
                auVar65 = vmulps_avx512vl(auVar47,auVar58);
                auVar64 = vmulps_avx512vl(auVar60,auVar62);
                auVar53 = vmulps_avx512vl(auVar58,auVar63);
                auVar54 = vmulps_avx512vl(auVar59,auVar61);
                auVar47 = vfmsub213ps_avx512vl(auVar47,auVar60,auVar50);
                auVar55 = vfmsub213ps_avx512vl(auVar57,auVar58,auVar52);
                auVar56 = vfmsub213ps_avx512vl(auVar56,auVar59,auVar65);
                auVar57 = vfmsub213ps_avx512vl(auVar63,auVar59,auVar64);
                auVar59 = vfmsub213ps_avx512vl(auVar61,auVar60,auVar53);
                auVar58 = vfmsub213ps_avx512vl(auVar62,auVar58,auVar54);
                vandps_avx512vl(auVar50,local_14e0);
                vandps_avx512vl(auVar64,local_14e0);
                uVar33 = vcmpps_avx512vl(auVar58,auVar58,1);
                vandps_avx512vl(auVar52,local_14e0);
                vandps_avx512vl(auVar53,local_14e0);
                auVar50 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                uVar29 = vcmpps_avx512vl(auVar58,auVar58,1);
                vandps_avx512vl(auVar65,local_14e0);
                vandps_avx512vl(auVar54,local_14e0);
                uVar22 = vcmpps_avx512vl(auVar50,auVar50,1);
                bVar17 = (bool)((byte)uVar33 & 1);
                local_1360._0_4_ =
                     (float)((uint)bVar17 * auVar47._0_4_ | (uint)!bVar17 * auVar57._0_4_);
                bVar17 = (bool)((byte)(uVar33 >> 1) & 1);
                local_1360._4_4_ =
                     (float)((uint)bVar17 * auVar47._4_4_ | (uint)!bVar17 * auVar57._4_4_);
                bVar17 = (bool)((byte)(uVar33 >> 2) & 1);
                local_1360._8_4_ =
                     (float)((uint)bVar17 * auVar47._8_4_ | (uint)!bVar17 * auVar57._8_4_);
                bVar17 = (bool)((byte)(uVar33 >> 3) & 1);
                local_1360._12_4_ =
                     (float)((uint)bVar17 * auVar47._12_4_ | (uint)!bVar17 * auVar57._12_4_);
                bVar17 = (bool)((byte)(uVar33 >> 4) & 1);
                local_1360._16_4_ =
                     (float)((uint)bVar17 * auVar47._16_4_ | (uint)!bVar17 * auVar57._16_4_);
                bVar17 = (bool)((byte)(uVar33 >> 5) & 1);
                local_1360._20_4_ =
                     (float)((uint)bVar17 * auVar47._20_4_ | (uint)!bVar17 * auVar57._20_4_);
                bVar17 = (bool)((byte)(uVar33 >> 6) & 1);
                local_1360._24_4_ =
                     (float)((uint)bVar17 * auVar47._24_4_ | (uint)!bVar17 * auVar57._24_4_);
                bVar17 = SUB81(uVar33 >> 7,0);
                local_1360._28_4_ = (uint)bVar17 * auVar47._28_4_ | (uint)!bVar17 * auVar57._28_4_;
                bVar17 = (bool)((byte)uVar29 & 1);
                local_1340._0_4_ =
                     (float)((uint)bVar17 * auVar55._0_4_ | (uint)!bVar17 * auVar59._0_4_);
                bVar17 = (bool)((byte)(uVar29 >> 1) & 1);
                local_1340._4_4_ =
                     (float)((uint)bVar17 * auVar55._4_4_ | (uint)!bVar17 * auVar59._4_4_);
                bVar17 = (bool)((byte)(uVar29 >> 2) & 1);
                local_1340._8_4_ =
                     (float)((uint)bVar17 * auVar55._8_4_ | (uint)!bVar17 * auVar59._8_4_);
                bVar17 = (bool)((byte)(uVar29 >> 3) & 1);
                local_1340._12_4_ =
                     (float)((uint)bVar17 * auVar55._12_4_ | (uint)!bVar17 * auVar59._12_4_);
                bVar17 = (bool)((byte)(uVar29 >> 4) & 1);
                local_1340._16_4_ =
                     (float)((uint)bVar17 * auVar55._16_4_ | (uint)!bVar17 * auVar59._16_4_);
                bVar17 = (bool)((byte)(uVar29 >> 5) & 1);
                local_1340._20_4_ =
                     (float)((uint)bVar17 * auVar55._20_4_ | (uint)!bVar17 * auVar59._20_4_);
                bVar17 = (bool)((byte)(uVar29 >> 6) & 1);
                local_1340._24_4_ =
                     (float)((uint)bVar17 * auVar55._24_4_ | (uint)!bVar17 * auVar59._24_4_);
                bVar17 = SUB81(uVar29 >> 7,0);
                local_1340._28_4_ = (uint)bVar17 * auVar55._28_4_ | (uint)!bVar17 * auVar59._28_4_;
                bVar17 = (bool)((byte)uVar22 & 1);
                local_1320._0_4_ =
                     (float)((uint)bVar17 * auVar56._0_4_ | (uint)!bVar17 * auVar58._0_4_);
                bVar17 = (bool)((byte)(uVar22 >> 1) & 1);
                local_1320._4_4_ =
                     (float)((uint)bVar17 * auVar56._4_4_ | (uint)!bVar17 * auVar58._4_4_);
                bVar17 = (bool)((byte)(uVar22 >> 2) & 1);
                local_1320._8_4_ =
                     (float)((uint)bVar17 * auVar56._8_4_ | (uint)!bVar17 * auVar58._8_4_);
                bVar17 = (bool)((byte)(uVar22 >> 3) & 1);
                local_1320._12_4_ =
                     (float)((uint)bVar17 * auVar56._12_4_ | (uint)!bVar17 * auVar58._12_4_);
                bVar17 = (bool)((byte)(uVar22 >> 4) & 1);
                local_1320._16_4_ =
                     (float)((uint)bVar17 * auVar56._16_4_ | (uint)!bVar17 * auVar58._16_4_);
                bVar17 = (bool)((byte)(uVar22 >> 5) & 1);
                local_1320._20_4_ =
                     (float)((uint)bVar17 * auVar56._20_4_ | (uint)!bVar17 * auVar58._20_4_);
                bVar17 = (bool)((byte)(uVar22 >> 6) & 1);
                local_1320._24_4_ =
                     (float)((uint)bVar17 * auVar56._24_4_ | (uint)!bVar17 * auVar58._24_4_);
                bVar17 = SUB81(uVar22 >> 7,0);
                local_1320._28_4_ = (uint)bVar17 * auVar56._28_4_ | (uint)!bVar17 * auVar58._28_4_;
                auVar26._4_4_ = fVar7 * local_1320._4_4_;
                auVar26._0_4_ = fVar7 * local_1320._0_4_;
                auVar26._8_4_ = fVar7 * local_1320._8_4_;
                auVar26._12_4_ = fVar7 * local_1320._12_4_;
                auVar26._16_4_ = fVar7 * local_1320._16_4_;
                auVar26._20_4_ = fVar7 * local_1320._20_4_;
                auVar26._24_4_ = fVar7 * local_1320._24_4_;
                auVar26._28_4_ = fVar7;
                auVar41 = vfmadd213ps_fma(auVar75,local_1340,auVar26);
                auVar41 = vfmadd213ps_fma(auVar72,local_1360,ZEXT1632(auVar41));
                auVar52 = ZEXT1632(CONCAT412(auVar41._12_4_ + auVar41._12_4_,
                                             CONCAT48(auVar41._8_4_ + auVar41._8_4_,
                                                      CONCAT44(auVar41._4_4_ + auVar41._4_4_,
                                                               auVar41._0_4_ + auVar41._0_4_))));
                auVar76._0_4_ = auVar48._0_4_ * local_1320._0_4_;
                auVar76._4_4_ = auVar48._4_4_ * local_1320._4_4_;
                auVar76._8_4_ = auVar48._8_4_ * local_1320._8_4_;
                auVar76._12_4_ = auVar48._12_4_ * local_1320._12_4_;
                auVar76._16_4_ = auVar48._16_4_ * local_1320._16_4_;
                auVar76._20_4_ = auVar48._20_4_ * local_1320._20_4_;
                auVar76._24_4_ = auVar48._24_4_ * local_1320._24_4_;
                auVar76._28_4_ = 0;
                auVar41 = vfmadd213ps_fma(auVar51,local_1340,auVar76);
                auVar18 = vfmadd213ps_fma(auVar46,local_1360,ZEXT1632(auVar41));
                auVar46 = vrcp14ps_avx512vl(auVar52);
                auVar47 = vfnmadd213ps_avx512vl(auVar46,auVar52,auVar49);
                auVar41 = vfmadd132ps_fma(auVar47,auVar46,auVar46);
                local_12a0 = ZEXT1632(CONCAT412((auVar18._12_4_ + auVar18._12_4_) * auVar41._12_4_,
                                                CONCAT48((auVar18._8_4_ + auVar18._8_4_) *
                                                         auVar41._8_4_,
                                                         CONCAT44((auVar18._4_4_ + auVar18._4_4_) *
                                                                  auVar41._4_4_,
                                                                  (auVar18._0_4_ + auVar18._0_4_) *
                                                                  auVar41._0_4_))));
                uVar69 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
                auVar67._4_4_ = uVar69;
                auVar67._0_4_ = uVar69;
                auVar67._8_4_ = uVar69;
                auVar67._12_4_ = uVar69;
                auVar67._16_4_ = uVar69;
                auVar67._20_4_ = uVar69;
                auVar67._24_4_ = uVar69;
                auVar67._28_4_ = uVar69;
                uVar20 = vcmpps_avx512vl(local_12a0,auVar67,0xd);
                auVar46 = vxorps_avx512vl(auVar52,auVar50);
                fVar7 = ray->tfar;
                auVar24._4_4_ = fVar7;
                auVar24._0_4_ = fVar7;
                auVar24._8_4_ = fVar7;
                auVar24._12_4_ = fVar7;
                auVar24._16_4_ = fVar7;
                auVar24._20_4_ = fVar7;
                auVar24._24_4_ = fVar7;
                auVar24._28_4_ = fVar7;
                uVar21 = vcmpps_avx512vl(local_12a0,auVar24,2);
                uVar23 = vcmpps_avx512vl(auVar52,auVar46,4);
                local_1300 = (byte)uVar20 & (byte)uVar21 & (byte)uVar23 & local_1300;
                if (local_1300 == 0) goto LAB_00729618;
                local_1220 = 0xf0;
                auVar25._8_4_ = 0x219392ef;
                auVar25._0_8_ = 0x219392ef219392ef;
                auVar25._12_4_ = 0x219392ef;
                auVar25._16_4_ = 0x219392ef;
                auVar25._20_4_ = 0x219392ef;
                auVar25._24_4_ = 0x219392ef;
                auVar25._28_4_ = 0x219392ef;
                uVar38 = vcmpps_avx512vl(local_14e0,auVar25,5);
                auVar46 = vrcp14ps_avx512vl(local_1380);
                auVar47 = vfnmadd213ps_avx512vl(local_1380,auVar46,auVar49);
                auVar47 = vfmadd132ps_avx512vl(auVar47,auVar46,auVar46);
                fVar1 = (float)((uint)((byte)uVar38 & 1) * auVar47._0_4_);
                fVar7 = (float)((uint)((byte)(uVar38 >> 1) & 1) * auVar47._4_4_);
                fVar2 = (float)((uint)((byte)(uVar38 >> 2) & 1) * auVar47._8_4_);
                fVar3 = (float)((uint)((byte)(uVar38 >> 3) & 1) * auVar47._12_4_);
                fVar4 = (float)((uint)((byte)(uVar38 >> 4) & 1) * auVar47._16_4_);
                fVar5 = (float)((uint)((byte)(uVar38 >> 5) & 1) * auVar47._20_4_);
                fVar6 = (float)((uint)((byte)(uVar38 >> 6) & 1) * auVar47._24_4_);
                auVar27._4_4_ = fVar7 * local_13c0._4_4_;
                auVar27._0_4_ = fVar1 * local_13c0._0_4_;
                auVar27._8_4_ = fVar2 * local_13c0._8_4_;
                auVar27._12_4_ = fVar3 * local_13c0._12_4_;
                auVar27._16_4_ = fVar4 * local_13c0._16_4_;
                auVar27._20_4_ = fVar5 * local_13c0._20_4_;
                auVar27._24_4_ = fVar6 * local_13c0._24_4_;
                auVar27._28_4_ = local_13c0._28_4_;
                auVar47 = vminps_avx512vl(auVar27,auVar49);
                auVar28._4_4_ = local_13a0._4_4_ * fVar7;
                auVar28._0_4_ = local_13a0._0_4_ * fVar1;
                auVar28._8_4_ = local_13a0._8_4_ * fVar2;
                auVar28._12_4_ = local_13a0._12_4_ * fVar3;
                auVar28._16_4_ = local_13a0._16_4_ * fVar4;
                auVar28._20_4_ = local_13a0._20_4_ * fVar5;
                auVar28._24_4_ = local_13a0._24_4_ * fVar6;
                auVar28._28_4_ = auVar46._28_4_;
                auVar46 = vminps_avx512vl(auVar28,auVar49);
                auVar48 = vsubps_avx512vl(auVar49,auVar47);
                auVar51 = vsubps_avx512vl(auVar49,auVar46);
                local_12c0 = vblendps_avx(auVar46,auVar48,0xf0);
                local_12e0 = vblendps_avx(auVar47,auVar51,0xf0);
                fVar7 = (float)DAT_02060940;
                fVar6 = DAT_02060940._4_4_;
                local_1280._4_4_ = local_1360._4_4_ * fVar6;
                local_1280._0_4_ = local_1360._0_4_ * fVar7;
                fVar5 = DAT_02060940._8_4_;
                local_1280._8_4_ = local_1360._8_4_ * fVar5;
                fVar4 = DAT_02060940._12_4_;
                local_1280._12_4_ = local_1360._12_4_ * fVar4;
                fVar3 = DAT_02060940._16_4_;
                local_1280._16_4_ = local_1360._16_4_ * fVar3;
                fVar2 = DAT_02060940._20_4_;
                local_1280._20_4_ = local_1360._20_4_ * fVar2;
                fVar1 = DAT_02060940._24_4_;
                local_1280._24_4_ = local_1360._24_4_ * fVar1;
                local_1280._28_4_ = local_1360._28_4_;
                local_1260._4_4_ = local_1340._4_4_ * fVar6;
                local_1260._0_4_ = local_1340._0_4_ * fVar7;
                local_1260._8_4_ = local_1340._8_4_ * fVar5;
                local_1260._12_4_ = local_1340._12_4_ * fVar4;
                local_1260._16_4_ = local_1340._16_4_ * fVar3;
                local_1260._20_4_ = local_1340._20_4_ * fVar2;
                local_1260._24_4_ = local_1340._24_4_ * fVar1;
                local_1260._28_4_ = local_1340._28_4_;
                local_1240._4_4_ = local_1320._4_4_ * fVar6;
                local_1240._0_4_ = local_1320._0_4_ * fVar7;
                local_1240._8_4_ = local_1320._8_4_ * fVar5;
                local_1240._12_4_ = local_1320._12_4_ * fVar4;
                local_1240._16_4_ = local_1320._16_4_ * fVar3;
                local_1240._20_4_ = local_1320._20_4_ * fVar2;
                local_1240._24_4_ = local_1320._24_4_ * fVar1;
                local_1240._28_4_ = local_1320._28_4_;
                uVar33 = (ulong)local_1300;
                auVar85 = ZEXT3264(local_1520);
                auVar74 = ZEXT3264(local_1540);
                auVar73 = ZEXT3264(local_1560);
                auVar77 = ZEXT3264(local_1580);
                do {
                  uVar38 = 0;
                  for (uVar39 = uVar33; (uVar39 & 1) == 0; uVar39 = uVar39 >> 1 | 0x8000000000000000
                      ) {
                    uVar38 = uVar38 + 1;
                  }
                  local_15c8 = *(uint *)((long)&local_13e0 + uVar38 * 4);
                  pGVar15 = (pSVar9->geometries).items[local_15c8].ptr;
                  if ((pGVar15->mask & ray->mask) == 0) {
                    uVar33 = uVar33 ^ 1L << (uVar38 & 0x3f);
                    bVar17 = true;
                  }
                  else {
                    pRVar16 = local_1618->args;
                    if ((pRVar16->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar15->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                      bVar17 = false;
                    }
                    else {
                      uVar39 = (ulong)(uint)((int)uVar38 * 4);
                      local_15b0.context = local_1618->user;
                      local_15e0 = *(undefined4 *)(local_1280 + uVar39);
                      local_15dc = *(undefined4 *)(local_1260 + uVar39);
                      local_15d8 = *(undefined4 *)(local_1240 + uVar39);
                      local_15d4 = *(undefined4 *)(local_12e0 + uVar39);
                      local_15d0 = *(undefined4 *)(local_12c0 + uVar39);
                      local_15cc = *(undefined4 *)((long)&local_1400 + uVar39);
                      local_15c4 = (local_15b0.context)->instID[0];
                      local_15c0 = (local_15b0.context)->instPrimID[0];
                      local_14e0._0_4_ = ray->tfar;
                      ray->tfar = *(float *)(local_12a0 + uVar39);
                      local_1624 = -1;
                      local_15b0.valid = &local_1624;
                      local_15b0.geometryUserPtr = pGVar15->userPtr;
                      local_15b0.ray = (RTCRayN *)ray;
                      local_15b0.hit = (RTCHitN *)&local_15e0;
                      local_15b0.N = 1;
                      local_1420 = auVar87._0_32_;
                      local_1440 = auVar88._0_32_;
                      local_1460 = auVar89._0_32_;
                      local_1480 = auVar90._0_32_;
                      local_14a0 = auVar91._0_32_;
                      local_14c0 = auVar92._0_32_;
                      if (pGVar15->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00729519:
                        if (pRVar16->filter != (RTCFilterFunctionN)0x0) {
                          if (((pRVar16->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                             (((pGVar15->field_8).field_0x2 & 0x40) != 0)) {
                            (*pRVar16->filter)(&local_15b0);
                            auVar77 = ZEXT3264(local_1580);
                            auVar73 = ZEXT3264(local_1560);
                            auVar74 = ZEXT3264(local_1540);
                            auVar85 = ZEXT3264(local_1520);
                            auVar92 = ZEXT3264(local_14c0);
                            auVar91 = ZEXT3264(local_14a0);
                            auVar90 = ZEXT3264(local_1480);
                            auVar89 = ZEXT3264(local_1460);
                            auVar88 = ZEXT3264(local_1440);
                            auVar87 = ZEXT3264(local_1420);
                            fVar68 = local_1500;
                            fVar78 = fStack_14fc;
                            fVar79 = fStack_14f8;
                            fVar80 = fStack_14f4;
                            fVar81 = fStack_14f0;
                            fVar82 = fStack_14ec;
                            fVar83 = fStack_14e8;
                          }
                          if (*local_15b0.valid == 0) goto LAB_007295c8;
                        }
                        bVar17 = false;
                      }
                      else {
                        local_1600 = uVar36;
                        local_15f8 = ray;
                        (*pGVar15->occlusionFilterN)(&local_15b0);
                        auVar77 = ZEXT3264(local_1580);
                        auVar73 = ZEXT3264(local_1560);
                        auVar74 = ZEXT3264(local_1540);
                        auVar85 = ZEXT3264(local_1520);
                        auVar92 = ZEXT3264(local_14c0);
                        auVar91 = ZEXT3264(local_14a0);
                        auVar90 = ZEXT3264(local_1480);
                        auVar89 = ZEXT3264(local_1460);
                        auVar88 = ZEXT3264(local_1440);
                        auVar87 = ZEXT3264(local_1420);
                        ray = local_15f8;
                        uVar36 = local_1600;
                        fVar68 = local_1500;
                        fVar78 = fStack_14fc;
                        fVar79 = fStack_14f8;
                        fVar80 = fStack_14f4;
                        fVar81 = fStack_14f0;
                        fVar82 = fStack_14ec;
                        fVar83 = fStack_14e8;
                        if (*local_15b0.valid != 0) goto LAB_00729519;
LAB_007295c8:
                        ray->tfar = (float)local_14e0._0_4_;
                        uVar33 = uVar33 ^ 1L << (uVar38 & 0x3f);
                        bVar17 = true;
                      }
                    }
                  }
                  iVar37 = 0;
                  uVar38 = local_1608;
                  uVar39 = local_1610;
                  if (!bVar17) {
                    if (bVar40) {
                      ray->tfar = -INFINITY;
                      iVar37 = 3;
                    }
                    goto LAB_0072966e;
                  }
                } while (uVar33 != 0);
              }
              iVar37 = 0;
              local_15e8 = local_15e8 + 1;
              bVar40 = local_15e8 < local_15f0;
            } while (local_15e8 != local_15f0);
          }
        }
LAB_0072966e:
      } while (iVar37 != 3);
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }